

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btCollisionWorld::serializeCollisionObjects(btCollisionWorld *this,btSerializer *serializer)

{
  int iVar1;
  btCollisionObject **ppbVar2;
  btCollisionShape **ppbVar3;
  undefined8 in_RSI;
  btHashPtr *in_RDI;
  btCollisionObject *colObj_1;
  btCollisionShape *shape;
  btCollisionObject *colObj;
  btHashMap<btHashPtr,_btCollisionShape_*> serializedShapes;
  int i;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  btHashMap<btHashPtr,_btCollisionShape_*> *in_stack_fffffffffffffef8;
  btHashMap<btHashPtr,_btCollisionShape_*> *in_stack_ffffffffffffff10;
  int iVar4;
  btHashMap<btHashPtr,_btCollisionShape_*> *in_stack_ffffffffffffff30;
  btCollisionObject *this_00;
  btHashPtr local_c8;
  btHashPtr local_c0;
  btCollisionShape *local_b8;
  btCollisionObject *local_b0;
  int local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  btHashMap<btHashPtr,_btCollisionShape_*>::btHashMap(in_stack_ffffffffffffff10);
  local_14 = 0;
  while (iVar4 = local_14,
        iVar1 = btAlignedObjectArray<btCollisionObject_*>::size
                          ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 1)), iVar4 < iVar1
        ) {
    ppbVar2 = btAlignedObjectArray<btCollisionObject_*>::operator[]
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 1),local_14);
    local_b0 = *ppbVar2;
    local_b8 = btCollisionObject::getCollisionShape(local_b0);
    btHashPtr::btHashPtr(&local_c0,local_b8);
    ppbVar3 = btHashMap<btHashPtr,_btCollisionShape_*>::find
                        (in_stack_fffffffffffffef8,
                         (btHashPtr *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
    ;
    if (ppbVar3 == (btCollisionShape **)0x0) {
      btHashPtr::btHashPtr(&local_c8,local_b8);
      btHashMap<btHashPtr,_btCollisionShape_*>::insert
                (in_stack_ffffffffffffff30,in_RDI,(btCollisionShape **)CONCAT44(iVar1,iVar4));
      (*local_b8->_vptr_btCollisionShape[0xf])(local_b8,local_10);
    }
    local_14 = local_14 + 1;
  }
  for (local_14 = 0; iVar4 = local_14,
      iVar1 = btAlignedObjectArray<btCollisionObject_*>::size
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 1)), iVar4 < iVar1;
      local_14 = local_14 + 1) {
    ppbVar2 = btAlignedObjectArray<btCollisionObject_*>::operator[]
                        ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 1),local_14);
    this_00 = *ppbVar2;
    in_stack_fffffffffffffef4 = btCollisionObject::getInternalType(this_00);
    if ((in_stack_fffffffffffffef4 == 1) ||
       (in_stack_fffffffffffffef0 = btCollisionObject::getInternalType(this_00),
       in_stack_fffffffffffffef0 == 0x40)) {
      (*this_00->_vptr_btCollisionObject[6])(this_00,local_10);
    }
  }
  btHashMap<btHashPtr,_btCollisionShape_*>::~btHashMap
            ((btHashMap<btHashPtr,_btCollisionShape_*> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return;
}

Assistant:

void	btCollisionWorld::serializeCollisionObjects(btSerializer* serializer)
{
	int i;

	///keep track of shapes already serialized
	btHashMap<btHashPtr,btCollisionShape*>	serializedShapes;

	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btCollisionShape* shape = colObj->getCollisionShape();

		if (!serializedShapes.find(shape))
		{
			serializedShapes.insert(shape,shape);
			shape->serializeSingleShape(serializer);
		}
	}

	//serialize all collision objects
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		if ((colObj->getInternalType() == btCollisionObject::CO_COLLISION_OBJECT) || (colObj->getInternalType() == btCollisionObject::CO_FEATHERSTONE_LINK))
		{
			colObj->serializeSingleObject(serializer);
		}
	}
}